

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderConstXmlLang(xmlTextReaderPtr reader)

{
  xmlChar *string;
  xmlChar *ret;
  xmlChar *tmp;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    string = xmlNodeGetLang(reader->node);
    if (string == (xmlChar *)0x0) {
      reader_local = (xmlTextReaderPtr)0x0;
    }
    else {
      reader_local = (xmlTextReaderPtr)constString(reader,string);
      (*xmlFree)(string);
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

const xmlChar *
xmlTextReaderConstXmlLang(xmlTextReaderPtr reader) {
    xmlChar *tmp;
    const xmlChar *ret;

    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    tmp = xmlNodeGetLang(reader->node);
    if (tmp == NULL)
        return(NULL);
    ret = constString(reader, tmp);
    xmlFree(tmp);
    return(ret);
}